

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int setup_center_error_facade
              (MACROBLOCKD *xd,AV1_COMMON *cm,MV *bestmv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
              MV_COST_PARAMS *mv_cost_params,uint *sse1,int *distortion,int is_scaled)

{
  uint uVar1;
  
  if (is_scaled != 0) {
    uVar1 = upsampled_setup_center_error(xd,cm,bestmv,var_params,mv_cost_params,sse1,distortion);
    return uVar1;
  }
  uVar1 = setup_center_error(xd,bestmv,var_params,mv_cost_params,sse1,distortion);
  return uVar1;
}

Assistant:

static inline int setup_center_error_facade(
    MACROBLOCKD *xd, const AV1_COMMON *cm, const MV *bestmv,
    const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *sse1, int *distortion,
    int is_scaled) {
  if (is_scaled) {
    return upsampled_setup_center_error(xd, cm, bestmv, var_params,
                                        mv_cost_params, sse1, distortion);
  } else {
    return setup_center_error(xd, bestmv, var_params, mv_cost_params, sse1,
                              distortion);
  }
}